

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcSetGeometryTimeRange(RTCGeometry hgeometry,float startTime,float endTime)

{
  BBox1f range;
  undefined8 *puVar1;
  allocator local_71;
  DeviceEnterLeave enterleave;
  string local_68 [32];
  float local_48;
  float local_38;
  
  local_48 = endTime;
  local_38 = startTime;
  if (hgeometry == (RTCGeometry)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_68,"invalid argument",(allocator *)&enterleave);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_68);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  (**(code **)(*(long *)hgeometry + 0x10))(hgeometry);
  embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hgeometry);
  if (local_38 <= local_48) {
    range.upper = local_48;
    range.lower = local_38;
    embree::Geometry::setTimeRange((Geometry *)hgeometry,range);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    (**(code **)(*(long *)hgeometry + 0x18))(hgeometry);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_68,"startTime has to be smaller or equal to the endTime",&local_71);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_68);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetGeometryTimeRange(RTCGeometry hgeometry, float startTime, float endTime)
  {
    Ref<Geometry> geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetGeometryTimeRange);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_ENTER_DEVICE(hgeometry);

    if (startTime > endTime)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"startTime has to be smaller or equal to the endTime");
        
    geometry->setTimeRange(BBox1f(startTime,endTime));
    RTC_CATCH_END2(geometry);
  }